

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O1

string * markdown::token::RawText::_processLinksImagesAndTags
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements,
                   LinkIds *idTable)

{
  char *pcVar1;
  size_type sVar2;
  shared_count sVar3;
  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
  *replacements_00;
  string sVar4;
  uint uVar5;
  int iVar6;
  const_reference pvVar7;
  long *plVar8;
  _List_node_base *p_Var9;
  Container *pCVar10;
  Image *this;
  RawText *pRVar11;
  HtmlAnchorTag *pHVar12;
  HtmlTag *pHVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  size_t sVar15;
  byte bVar16;
  ulong *puVar17;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  long lVar18;
  undefined8 uVar19;
  byte *pbVar20;
  string *psVar21;
  _Alloc_hider _Var22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  byte bVar26;
  bool bVar27;
  string contentsOrAlttext;
  string linkId;
  string url;
  optional<markdown::LinkIds::Target> target;
  string title;
  smatch m;
  string local_1f0;
  char local_1c9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  string local_1c0;
  undefined1 local_1a0 [32];
  string *local_180;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 auStack_14e [34];
  bool local_12c;
  string local_120;
  shared_ptr<markdown::Token> local_100;
  _List_node_base local_f0;
  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  LinkIds *local_50;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_48;
  
  local_180 = __return_storage_ptr__;
  local_e0 = (vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
              *)replacements;
  local_50 = idTable;
  if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
       ::cExpression == '\0') &&
     (iVar6 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                   ::cExpression), iVar6 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&_processLinksImagesAndTags::cExpression,
                "(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)|(?:<(/?([a-zA-Z0-9]+).*?)>)"
                ,0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&_processLinksImagesAndTags::cExpression,&__dso_handle);
    __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                         ::cExpression);
    replacements = (ReplacementTable *)local_e0;
    __return_storage_ptr__ = local_180;
  }
  local_1c8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  first._M_current = (src->_M_dataplus)._M_p;
  local_b0._M_current = first._M_current + src->_M_string_length;
  do {
    local_a8.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_a8.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_a8.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.m_base._M_current = (char *)0x0;
    local_a8.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.m_null.matched = false;
    local_a8.m_named_subs.px = (element_type *)0x0;
    local_a8.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
    local_a8.m_last_closed_paren = 0;
    local_a8.m_is_singular = true;
    local_1c9 = boost::
                regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                          (first,local_b0,&local_a8,&_processLinksImagesAndTags::cExpression,
                           format_default,first);
    if ((bool)local_1c9) {
      pvVar7 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_a8,0);
      if (pvVar7->matched == false) {
        __assert_fail("m[0].matched",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x17d,
                      "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                     );
      }
      pvVar7 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_a8,0);
      if ((pvVar7->matched != true) ||
         ((pvVar7->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).second._M_current ==
          (pvVar7->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).first._M_current)) {
        __assert_fail("m[0].length()!=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x17e,
                      "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                     );
      }
      pvVar7 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_a8,0);
      local_178._0_8_ = &local_168;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_178,first._M_current,
                 (pvVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_178._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._0_8_ != &local_168) {
        operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
      }
      local_1c0._M_dataplus._M_p =
           (pointer)((long)*(pointer *)((long)replacements + 8) - *(long *)replacements >> 4);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      auStack_14e._6_8_ = local_178 + 2;
      local_1c0.field_2._M_local_buf[0] = 0x30;
      local_1c0.field_2._M_allocated_capacity._4_4_ = 0x30;
      local_1c0._M_string_length = (size_type)((long)register0x00000020 + -0x14e);
      auStack_14e._14_8_ = (string *)((long)register0x00000020 + -0x14e);
      auStack_14e._6_8_ =
           boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::convert
                     ((lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> *)&local_1c0)
      ;
      auStack_14e._14_8_ = (string *)((long)register0x00000020 + -0x14e);
      std::__cxx11::string::replace
                ((ulong)&local_120,0,(char *)local_120._M_string_length,auStack_14e._6_8_);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x158235);
      local_1a0._0_8_ = &((string *)local_1a0)->field_2;
      psVar21 = (string *)(plVar8 + 2);
      if ((string *)*plVar8 == psVar21) {
        local_1a0._16_8_ = (psVar21->_M_dataplus)._M_p;
        local_1a0._24_8_ = plVar8[3];
      }
      else {
        local_1a0._16_8_ = (psVar21->_M_dataplus)._M_p;
        local_1a0._0_8_ = (string *)*plVar8;
      }
      local_1a0._8_8_ = plVar8[1];
      *plVar8 = (long)psVar21;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)local_1a0);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      puVar17 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_1f0.field_2._M_allocated_capacity = *puVar17;
        local_1f0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *puVar17;
        local_1f0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1f0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar17;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((string *)local_1a0._0_8_ != (string *)&((string *)local_1a0)->field_2) {
        operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      pvVar7 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_a8,0);
      first._M_current =
           (pvVar7->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
      pvVar7 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_a8,4);
      if (((pvVar7->matched == true) &&
          (pvVar7 = boost::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&local_a8,4), pvVar7->matched == true)) &&
         ((pvVar7->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).second._M_current !=
          (pvVar7->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).first._M_current)) {
        bVar27 = true;
        bVar16 = 0;
        bVar26 = 1;
      }
      else {
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,1);
        if (((pvVar7->matched == true) &&
            (pvVar7 = boost::
                      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&local_a8,1), pvVar7->matched == true)) &&
           ((pvVar7->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).second._M_current !=
            (pvVar7->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).first._M_current)) {
          bVar26 = 1;
          bVar16 = 0;
          bVar27 = false;
        }
        else {
          pvVar7 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&local_a8,5);
          if (pvVar7->matched == false) {
            pvVar7 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&local_a8,2);
            bVar16 = pvVar7->matched;
            bVar27 = false;
            bVar26 = 0;
          }
          else {
            bVar16 = 1;
            bVar26 = 0;
            bVar27 = true;
          }
        }
      }
      if ((bVar16 | bVar26) != 1) {
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,7);
        local_178._0_8_ = &local_168;
        if (pvVar7->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_178,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_178._8_8_ = (type)0x0;
          local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
        }
        uVar19 = local_178._0_8_;
        bVar27 = true;
        lVar18 = 0;
        do {
          pbVar20 = (&PTR_anon_var_dwarf_c975e_001687b0)[lVar18];
          bVar16 = *(byte *)local_178._0_8_;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._0_8_;
          while ((bVar16 != 0 &&
                 (paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar23->_M_local_buf + 1), bVar16 == *pbVar20))) {
            pbVar20 = pbVar20 + 1;
            bVar16 = paVar23->_M_local_buf[0];
          }
          if (*pbVar20 == 0) break;
          lVar18 = lVar18 + 1;
          bVar27 = lVar18 != 7;
        } while (bVar27);
        if (bVar27) {
          local_1a0._0_8_ = local_1a0;
          local_1a0._16_8_ = 0;
          local_1a0._8_8_ = local_1a0._0_8_;
          pHVar12 = (HtmlAnchorTag *)operator_new(0x30);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_allocated_capacity =
               local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          HtmlAnchorTag::HtmlAnchorTag(pHVar12,(string *)local_178,&local_1f0);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                    ((shared_ptr<markdown::Token> *)&local_120,pHVar12);
          p_Var9 = (_List_node_base *)operator_new(0x20);
          sVar2 = local_120._M_string_length;
          p_Var9[1]._M_next = (_List_node_base *)local_120._M_dataplus._M_p;
          p_Var9[1]._M_prev = (_List_node_base *)0x0;
          local_120._M_string_length = 0;
          p_Var9[1]._M_prev = (_List_node_base *)sVar2;
          local_120._M_dataplus._M_p = (pointer)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          local_1a0._16_8_ = local_1a0._16_8_ + 1;
          boost::detail::shared_count::~shared_count((shared_count *)&local_120._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          pRVar11 = (RawText *)operator_new(0x30);
          (pRVar11->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_001682d0;
          (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
               (pointer)&(pRVar11->super_TextHolder).mText.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(pRVar11->super_TextHolder).mText,local_178._0_8_,
                     (byte *)(local_178._0_8_ + local_178._8_8_));
          (pRVar11->super_TextHolder).mCanContainMarkup = false;
          (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
          (pRVar11->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_00168388;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                    ((shared_ptr<markdown::Token> *)&local_1f0,pRVar11);
          p_Var9 = (_List_node_base *)operator_new(0x20);
          sVar2 = local_1f0._M_string_length;
          p_Var9[1]._M_next = (_List_node_base *)local_1f0._M_dataplus._M_p;
          p_Var9[1]._M_prev = (_List_node_base *)0x0;
          local_1f0._M_string_length = 0;
          p_Var9[1]._M_prev = (_List_node_base *)sVar2;
          local_1f0._M_dataplus._M_p = (pointer)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          local_1a0._16_8_ = local_1a0._16_8_ + 1;
          boost::detail::shared_count::~shared_count((shared_count *)&local_1f0._M_string_length);
          pHVar13 = (HtmlTag *)operator_new(0x30);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/a","");
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_001682d0;
          (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
               (pointer)&(pHVar13->super_TextHolder).mText.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(pHVar13->super_TextHolder).mText,local_1f0._M_dataplus._M_p,
                     local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
          (pHVar13->super_TextHolder).mCanContainMarkup = false;
          (pHVar13->super_TextHolder).mEncodingFlags = 5;
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_00168060;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                    ((shared_ptr<markdown::Token> *)&local_120,pHVar13);
          p_Var9 = (_List_node_base *)operator_new(0x20);
          sVar2 = local_120._M_string_length;
          p_Var9[1]._M_next = (_List_node_base *)local_120._M_dataplus._M_p;
          p_Var9[1]._M_prev = (_List_node_base *)0x0;
          local_120._M_string_length = 0;
          p_Var9[1]._M_prev = (_List_node_base *)sVar2;
          local_120._M_dataplus._M_p = (pointer)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          local_1a0._16_8_ = local_1a0._16_8_ + 1;
          boost::detail::shared_count::~shared_count((shared_count *)&local_120._M_string_length);
          replacements = (ReplacementTable *)local_e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          pCVar10 = (Container *)operator_new(0x28);
          (pCVar10->super_Token)._vptr_Token = (_func_int **)&PTR__Container_001685b0;
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::list(&pCVar10->mSubTokens,
                 (list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                  *)local_1a0);
          pCVar10->mParagraphMode = false;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                    ((shared_ptr<markdown::Token> *)&local_1f0,pCVar10);
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                      *)replacements,(shared_ptr<markdown::Token> *)&local_1f0);
          boost::detail::shared_count::~shared_count((shared_count *)&local_1f0._M_string_length);
          psVar21 = (string *)local_1a0;
LAB_00149cad:
          std::__cxx11::
          _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::_M_clear((_List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                      *)psVar21);
        }
        else {
          local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_178._0_8_ + local_178._8_8_);
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._0_8_;
          if (0 < (long)local_178._8_8_ >> 2) {
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_178._0_8_ + (local_178._8_8_ & 0xfffffffffffffffc));
            lVar18 = ((long)local_178._8_8_ >> 2) + 1;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_178._0_8_ + 3);
            do {
              bVar16 = paVar24->_M_local_buf[-3];
              iVar6 = isalnum((int)(char)bVar16);
              if ((iVar6 == 0) &&
                 ((uVar5 = bVar16 - 0x25, 0x3a < uVar5 ||
                  ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
                paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar24->_M_local_buf + -3);
                paVar25 = local_d8;
                goto LAB_0014a83b;
              }
              bVar16 = paVar24->_M_local_buf[-2];
              iVar6 = isalnum((int)(char)bVar16);
              if ((iVar6 == 0) &&
                 ((uVar5 = bVar16 - 0x25, 0x3a < uVar5 ||
                  ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
                paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar24->_M_local_buf + -2);
                paVar25 = local_d8;
                goto LAB_0014a83b;
              }
              bVar16 = paVar24->_M_local_buf[-1];
              iVar6 = isalnum((int)(char)bVar16);
              if ((iVar6 == 0) &&
                 ((uVar5 = bVar16 - 0x25, 0x3a < uVar5 ||
                  ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
                paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar24->_M_local_buf + -1);
                paVar25 = local_d8;
                goto LAB_0014a83b;
              }
              bVar16 = paVar24->_M_local_buf[0];
              iVar6 = isalnum((int)(char)bVar16);
              if ((iVar6 == 0) &&
                 ((uVar5 = bVar16 - 0x25, paVar25 = local_d8, 0x3a < uVar5 ||
                  ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) goto LAB_0014a83b;
              lVar18 = lVar18 + -1;
              paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar24->_M_local_buf + 4);
            } while (1 < lVar18);
          }
          paVar25 = local_d8;
          lVar18 = (long)local_d8 - (long)paVar23;
          paVar24 = paVar25;
          if (lVar18 == 1) {
LAB_00149e5e:
            bVar16 = paVar23->_M_local_buf[0];
            iVar6 = isalnum((int)(char)bVar16);
            if ((iVar6 == 0) &&
               ((uVar5 = bVar16 - 0x25, 0x3a < uVar5 ||
                ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) goto LAB_00149e99;
          }
          else {
            if (lVar18 == 2) {
LAB_00149e2e:
              bVar16 = paVar23->_M_local_buf[0];
              iVar6 = isalnum((int)(char)bVar16);
              if ((iVar6 != 0) ||
                 ((uVar5 = bVar16 - 0x25, uVar5 < 0x3b &&
                  ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) {
                paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar23->_M_local_buf + 1);
                goto LAB_00149e5e;
              }
            }
            else {
              if (lVar18 != 3) goto LAB_0014a83b;
              bVar16 = paVar23->_M_local_buf[0];
              iVar6 = isalnum((int)(char)bVar16);
              if ((iVar6 != 0) ||
                 ((uVar5 = bVar16 - 0x25, uVar5 < 0x3b &&
                  ((0x400000000000341U >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) {
                paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar23->_M_local_buf + 1);
                goto LAB_00149e2e;
              }
            }
LAB_00149e99:
            paVar24 = paVar23;
          }
LAB_0014a83b:
          if (((paVar24 != paVar25) &&
              (paVar24 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar19)) && (paVar24->_M_local_buf[0] == 0x40)) {
            _Var14 = std::
                     __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                               (paVar24->_M_local_buf + 1,paVar25,
                                anon_unknown_0::notValidSiteCharacter);
            uVar19 = local_178._0_8_;
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_178._0_8_ + local_178._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var14._M_current == paVar23) {
              paVar24 = paVar23;
              if (0 < (long)local_178._8_8_ >> 2) {
                paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_178._0_8_ + (ulong)((uint)local_178._8_8_ & 3));
                lVar18 = ((long)local_178._8_8_ >> 2) + 1;
                paVar25 = paVar23;
                do {
                  iVar6 = isalpha((int)paVar25->_M_local_buf[-1]);
                  if (iVar6 == 0) goto LAB_0014ab97;
                  iVar6 = isalpha((int)paVar25->_M_local_buf[-2]);
                  if (iVar6 == 0) {
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar25->_M_local_buf + -1);
                    goto LAB_0014ab97;
                  }
                  iVar6 = isalpha((int)paVar25->_M_local_buf[-3]);
                  if (iVar6 == 0) {
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar25->_M_local_buf + -2);
                    goto LAB_0014ab97;
                  }
                  iVar6 = isalpha((int)paVar25->_M_local_buf[-4]);
                  if (iVar6 == 0) {
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar25->_M_local_buf + -3);
                    goto LAB_0014ab97;
                  }
                  paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar25->_M_local_buf + -4);
                  lVar18 = lVar18 + -1;
                } while (1 < lVar18);
              }
              lVar18 = (long)paVar24 - uVar19;
              if (lVar18 == 1) {
LAB_0014ab6c:
                iVar6 = isalpha((int)paVar24->_M_local_buf[-1]);
                paVar25 = paVar24;
                if (iVar6 != 0) {
                  paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)uVar19;
                }
              }
              else if (lVar18 == 2) {
LAB_0014ab5a:
                iVar6 = isalpha((int)paVar24->_M_local_buf[-1]);
                paVar25 = paVar24;
                if (iVar6 != 0) {
                  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar24->_M_local_buf + -1);
                  goto LAB_0014ab6c;
                }
              }
              else {
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)uVar19;
                if ((lVar18 == 3) &&
                   (iVar6 = isalpha((int)paVar24->_M_local_buf[-1]), paVar25 = paVar24, iVar6 != 0))
                {
                  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar24->_M_local_buf + -1);
                  goto LAB_0014ab5a;
                }
              }
LAB_0014ab97:
              if (((paVar25 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar19) && (paVar25->_M_local_buf[-1] == 0x2e)) &&
                 (paVar23->_M_local_buf + (-2 - (long)paVar25) < (byte *)0x3)) {
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0;
                local_1c0.field_2._M_allocated_capacity = 0;
                local_1c0._M_string_length = (size_type)local_1c0._M_dataplus._M_p;
                pHVar12 = (HtmlAnchorTag *)operator_new(0x30);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a0,"mailto:",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_178);
                anon_unknown_0::emailEncode
                          (&local_1f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0);
                __return_storage_ptr__ = local_180;
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                local_120._M_string_length = 0;
                local_120.field_2._M_local_buf[0] = '\0';
                HtmlAnchorTag::HtmlAnchorTag(pHVar12,&local_1f0,&local_120);
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                          (&local_100,pHVar12);
                p_Var9 = (_List_node_base *)operator_new(0x20);
                sVar3.pi_ = local_100.pn.pi_;
                p_Var9[1]._M_next = (_List_node_base *)local_100.px;
                p_Var9[1]._M_prev = (_List_node_base *)0x0;
                local_100.pn.pi_ = (sp_counted_base *)0x0;
                p_Var9[1]._M_prev = (_List_node_base *)sVar3.pi_;
                local_100.px = (element_type *)0x0;
                std::__detail::_List_node_base::_M_hook(p_Var9);
                local_1c0.field_2._M_allocated_capacity =
                     local_1c0.field_2._M_allocated_capacity + 1;
                boost::detail::shared_count::~shared_count(&local_100.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                           local_120.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if ((string *)local_1a0._0_8_ != (string *)&((string *)local_1a0)->field_2) {
                  operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
                }
                pRVar11 = (RawText *)operator_new(0x30);
                anon_unknown_0::emailEncode(&local_1f0,(string *)local_178);
                (pRVar11->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_001682d0;
                (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
                     (pointer)&(pRVar11->super_TextHolder).mText.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&(pRVar11->super_TextHolder).mText,local_1f0._M_dataplus._M_p,
                           local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
                (pRVar11->super_TextHolder).mCanContainMarkup = false;
                (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
                (pRVar11->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_00168388;
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                          ((shared_ptr<markdown::Token> *)local_1a0,pRVar11);
                p_Var9 = (_List_node_base *)operator_new(0x20);
                uVar19 = local_1a0._8_8_;
                p_Var9[1]._M_next = (_List_node_base *)local_1a0._0_8_;
                p_Var9[1]._M_prev = (_List_node_base *)0x0;
                local_1a0._8_8_ = (_List_node_base *)0x0;
                p_Var9[1]._M_prev = (_List_node_base *)uVar19;
                local_1a0._0_8_ = (_List_node_base *)0x0;
                std::__detail::_List_node_base::_M_hook(p_Var9);
                local_1c0.field_2._M_allocated_capacity =
                     local_1c0.field_2._M_allocated_capacity + 1;
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&((string *)local_1a0)->_M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                pHVar13 = (HtmlTag *)operator_new(0x30);
                local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/a","");
                (pHVar13->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_001682d0;
                (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
                     (pointer)&(pHVar13->super_TextHolder).mText.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&(pHVar13->super_TextHolder).mText,local_1f0._M_dataplus._M_p,
                           local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
                (pHVar13->super_TextHolder).mCanContainMarkup = false;
                (pHVar13->super_TextHolder).mEncodingFlags = 5;
                (pHVar13->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_00168060;
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                          ((shared_ptr<markdown::Token> *)local_1a0,pHVar13);
                p_Var9 = (_List_node_base *)operator_new(0x20);
                uVar19 = local_1a0._8_8_;
                p_Var9[1]._M_next = (_List_node_base *)local_1a0._0_8_;
                p_Var9[1]._M_prev = (_List_node_base *)0x0;
                local_1a0._8_8_ = (string *)0x0;
                p_Var9[1]._M_prev = (_List_node_base *)uVar19;
                local_1a0._0_8_ = (string *)0x0;
                std::__detail::_List_node_base::_M_hook(p_Var9);
                local_1c0.field_2._M_allocated_capacity =
                     local_1c0.field_2._M_allocated_capacity + 1;
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&((string *)local_1a0)->_M_string_length);
                replacements = (ReplacementTable *)local_e0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                pCVar10 = (Container *)operator_new(0x28);
                (pCVar10->super_Token)._vptr_Token = (_func_int **)&PTR__Container_001685b0;
                std::__cxx11::
                list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                ::list(&pCVar10->mSubTokens,
                       (list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                        *)&local_1c0);
                pCVar10->mParagraphMode = false;
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                          ((shared_ptr<markdown::Token> *)&local_1f0,pCVar10);
                std::
                vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                ::emplace_back<boost::shared_ptr<markdown::Token>>
                          ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                            *)replacements,(shared_ptr<markdown::Token> *)&local_1f0);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_1f0._M_string_length);
                psVar21 = &local_1c0;
                goto LAB_00149cad;
              }
            }
          }
          __return_storage_ptr__ = local_180;
          pvVar7 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&local_a8,8);
          replacements_00 = local_e0;
          if (pvVar7->matched == true) {
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1f0,
                       (pvVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (pvVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            local_1f0._M_string_length = 0;
            local_1f0.field_2._M_allocated_capacity =
                 local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          sVar15 = isValidTag(&local_1f0,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (sVar15 == 0) {
            pRVar11 = (RawText *)operator_new(0x30);
            pvVar7 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&local_a8,0);
            if (pvVar7->matched == true) {
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_1f0,
                         (pvVar7->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current,
                         (pvVar7->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current);
            }
            else {
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              local_1f0._M_string_length = 0;
              local_1f0.field_2._M_allocated_capacity =
                   local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            (pRVar11->super_TextHolder).super_Token._vptr_Token =
                 (_func_int **)&PTR__TextHolder_001682d0;
            (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
                 (pointer)&(pRVar11->super_TextHolder).mText.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&(pRVar11->super_TextHolder).mText,local_1f0._M_dataplus._M_p,
                       local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
            (pRVar11->super_TextHolder).mCanContainMarkup = true;
            (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
            (pRVar11->super_TextHolder).super_Token._vptr_Token =
                 (_func_int **)&PTR__TextHolder_00168388;
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                      ((shared_ptr<markdown::Token> *)local_1a0,pRVar11);
            replacements = (ReplacementTable *)local_e0;
            std::
            vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
            ::emplace_back<boost::shared_ptr<markdown::Token>>
                      (local_e0,(shared_ptr<markdown::Token> *)local_1a0);
          }
          else {
            pHVar13 = (HtmlTag *)operator_new(0x30);
            _restoreProcessedItems
                      (&local_1f0,(string *)local_178,(ReplacementTable *)replacements_00);
            (pHVar13->super_TextHolder).super_Token._vptr_Token =
                 (_func_int **)&PTR__TextHolder_001682d0;
            (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
                 (pointer)&(pHVar13->super_TextHolder).mText.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&(pHVar13->super_TextHolder).mText,local_1f0._M_dataplus._M_p,
                       local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
            (pHVar13->super_TextHolder).mCanContainMarkup = false;
            (pHVar13->super_TextHolder).mEncodingFlags = 5;
            (pHVar13->super_TextHolder).super_Token._vptr_Token =
                 (_func_int **)&PTR__TextHolder_00168060;
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                      ((shared_ptr<markdown::Token> *)local_1a0,pHVar13);
            replacements = (ReplacementTable *)local_e0;
            std::
            vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
            ::emplace_back<boost::shared_ptr<markdown::Token>>
                      (local_e0,(shared_ptr<markdown::Token> *)local_1a0);
          }
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&((string *)local_1a0)->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_0014aa89;
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_allocated_capacity =
           local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a0._0_8_ = &((string *)local_1a0)->field_2;
      local_1a0._8_8_ = (string *)0x0;
      local_1a0._16_8_ = local_1a0._16_8_ & 0xffffffffffffff00;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      if (bVar27) {
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,5);
        if (pvVar7->matched == true) {
          local_178._0_8_ = &local_168;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_178,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_178._0_8_ = &local_168;
          local_178._8_8_ = (type)0x0;
          local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
        }
        std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._0_8_ != &local_168) {
          operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
        }
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,6);
        if ((pvVar7->matched == true) &&
           (pvVar7 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&local_a8,6), pvVar7->matched == true)) {
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1c0,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          local_1c0._M_string_length = 0;
          local_1c0.field_2._M_allocated_capacity =
               local_1c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        sVar2 = local_1f0._M_string_length;
        _Var22._M_p = local_1f0._M_dataplus._M_p;
        if ((string *)local_1c0._M_string_length == (string *)0x0) {
          local_178._0_8_ = &local_168;
          local_178._8_8_ = (type)0x0;
          local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
          if (local_1f0._M_string_length != 0) {
            lVar18 = 0;
            do {
              if (((_Var22._M_p[lVar18] != 0x20) || ((type)local_178._8_8_ == (type)0x0)) ||
                 (*(byte *)(local_178._0_8_ + (local_178._8_8_ - 1)) != 0x20)) {
                std::__cxx11::string::push_back((char)local_178);
              }
              lVar18 = lVar18 + 1;
            } while (sVar2 != lVar18);
          }
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)local_178);
          __return_storage_ptr__ = local_180;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._0_8_ != &local_168) {
            operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
            __return_storage_ptr__ = local_180;
          }
        }
        LinkIds::find((optional<markdown::LinkIds::Target> *)local_178,local_50,&local_1c0);
        sVar4 = local_178[0];
        if (local_178[0] == (string)0x1) {
          std::__cxx11::string::_M_assign((string *)local_1a0);
          if (local_178[0] == (string)0x0) {
            __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                          "pointer_type boost::optional<markdown::LinkIds::Target>::operator->() [T = markdown::LinkIds::Target]"
                         );
          }
          std::__cxx11::string::_M_assign((string *)&local_120);
        }
        boost::optional_detail::optional_base<markdown::LinkIds::Target>::~optional_base
                  ((optional_base<markdown::LinkIds::Target> *)local_178);
      }
      else {
        if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
             ::cReference == '\0') &&
           (iVar6 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                         ::cReference), iVar6 != 0)) {
          boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
          basic_regex(&_processLinksImagesAndTags::cReference,
                      "^<?([^ >]*)>?(?: *(?:(\'|\")(.*)\\2)|(?:\\((.*)\\)))? *$",0);
          __cxa_atexit(boost::
                       basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                       ::~basic_regex,&_processLinksImagesAndTags::cReference,&__dso_handle);
          __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                               ::cReference);
          replacements = (ReplacementTable *)local_e0;
          __return_storage_ptr__ = local_180;
        }
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,2);
        if (pvVar7->matched == true) {
          local_178._0_8_ = &local_168;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_178,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_178._0_8_ = &local_168;
          local_178._8_8_ = (type)0x0;
          local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
        }
        std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._0_8_ != &local_168) {
          operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
        }
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,3);
        if (pvVar7->matched == true) {
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1c0,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          local_1c0._M_string_length = 0;
          local_1c0.field_2._M_allocated_capacity =
               local_1c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        local_158 = 0;
        uStack_150 = 0;
        local_168._M_allocated_capacity = 0;
        local_168._8_8_ = 0;
        local_178._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_178._8_8_ = (type)0x0;
        auStack_14e._6_8_ = auStack_14e._6_8_ & 0xffffffffffffff00;
        auStack_14e._14_8_ = (string *)0x0;
        auStack_14e._22_8_ = 0;
        auStack_14e._30_4_ = 0;
        local_12c = true;
        sVar4 = (string)boost::
                        regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_1c0._M_dataplus._M_p,
                                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(local_1c0._M_dataplus._M_p + local_1c0._M_string_length),
                                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)local_178,&_processLinksImagesAndTags::cReference,
                                   format_default);
        if ((bool)sVar4) {
          pvVar7 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_178,1);
          if (pvVar7->matched == true) {
            local_100.px = (element_type *)&local_f0;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_100,
                       (pvVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (pvVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_100.px = (element_type *)&local_f0;
            local_100.pn.pi_ = (sp_counted_base *)0x0;
            local_f0._M_next = (_List_node_base *)((ulong)local_f0._M_next & 0xffffffffffffff00);
          }
          std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_100);
          if ((_List_node_base *)local_100.px != &local_f0) {
            operator_delete(local_100.px,(ulong)((long)&(local_f0._M_next)->_M_next + 1));
          }
          pvVar7 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_178,3);
          if (pvVar7->matched == true) {
            pvVar7 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_178,3);
            if (pvVar7->matched == true) {
              local_100.px = (element_type *)&local_f0;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_100,
                         (pvVar7->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current,
                         (pvVar7->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current);
            }
            else {
LAB_0014a2ee:
              local_100.px = (element_type *)&local_f0;
              local_100.pn.pi_ = (sp_counted_base *)0x0;
              local_f0._M_next = (_List_node_base *)((ulong)local_f0._M_next & 0xffffffffffffff00);
            }
          }
          else {
            pvVar7 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_178,4);
            if (pvVar7->matched != true) goto LAB_0014a34c;
            pvVar7 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_178,4);
            if (pvVar7->matched != true) goto LAB_0014a2ee;
            local_100.px = (element_type *)&local_f0;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_100,
                       (pvVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (pvVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          std::__cxx11::string::operator=((string *)&local_120,(string *)&local_100);
          if ((_List_node_base *)local_100.px != &local_f0) {
            operator_delete(local_100.px,(ulong)((long)&(local_f0._M_next)->_M_next + 1));
          }
        }
LAB_0014a34c:
        boost::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if (sVar4 == (string)0x0) {
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,0);
        pcVar1 = (pvVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pRVar11 = (RawText *)operator_new(0x30);
        pvVar7 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_a8,0);
        first._M_current = pcVar1 + 1;
        local_178._0_8_ = &local_168;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_178,
                   (pvVar7->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,first._M_current);
        (pRVar11->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_001682d0;
        (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
             (pointer)&(pRVar11->super_TextHolder).mText.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(pRVar11->super_TextHolder).mText,local_178._0_8_,
                   (byte *)(local_178._0_8_ + local_178._8_8_));
        (pRVar11->super_TextHolder).mCanContainMarkup = true;
        (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
        (pRVar11->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_00168388;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                  ((shared_ptr<markdown::Token> *)&local_1c0,pRVar11);
        replacements = (ReplacementTable *)local_e0;
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  (local_e0,(shared_ptr<markdown::Token> *)&local_1c0);
LAB_0014a79f:
        boost::detail::shared_count::~shared_count((shared_count *)&local_1c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._0_8_ != &local_168) {
          operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
        }
      }
      else {
        if (bVar26 == 0) {
          pHVar12 = (HtmlAnchorTag *)operator_new(0x30);
          HtmlAnchorTag::HtmlAnchorTag(pHVar12,(string *)local_1a0,&local_120);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                    ((shared_ptr<markdown::Token> *)local_178,pHVar12);
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                      *)replacements,(shared_ptr<markdown::Token> *)local_178);
          boost::detail::shared_count::~shared_count((shared_count *)(local_178 + 8));
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
          local_48.m_value = *(long *)((long)replacements + 8) - *(long *)replacements >> 4;
          local_d0 = &local_c0;
          local_c8 = (char *)0x0;
          local_c0 = 0;
          auStack_14e._6_8_ = local_178 + 2;
          local_48.m_czero = '0';
          local_48.m_zero = 0x30;
          auStack_14e._14_8_ = (string *)((long)register0x00000020 + -0x14e);
          local_48.m_finish = (char *)((long)register0x00000020 + -0x14e);
          auStack_14e._6_8_ =
               boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::
               convert(&local_48);
          auStack_14e._14_8_ = (string *)((long)register0x00000020 + -0x14e);
          std::__cxx11::string::replace((ulong)&local_d0,0,local_c8,auStack_14e._6_8_);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x158235);
          p_Var9 = (_List_node_base *)(plVar8 + 2);
          if ((_List_node_base *)*plVar8 == p_Var9) {
            local_f0._M_next = p_Var9->_M_next;
            local_f0._M_prev = (_List_node_base *)plVar8[3];
            local_100.px = (element_type *)&local_f0;
          }
          else {
            local_f0._M_next = p_Var9->_M_next;
            local_100.px = (element_type *)*plVar8;
          }
          local_100.pn.pi_ = (sp_counted_base *)plVar8[1];
          *plVar8 = (long)p_Var9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
          psVar21 = (string *)(plVar8 + 2);
          if ((string *)*plVar8 == psVar21) {
            local_1c0.field_2._M_allocated_capacity = (size_type)psVar21->_M_dataplus;
            local_1c0.field_2._8_8_ = plVar8[3];
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          }
          else {
            local_1c0.field_2._M_allocated_capacity = (size_type)psVar21->_M_dataplus;
            local_1c0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_1c0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar21;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          if ((_List_node_base *)local_100.px != &local_f0) {
            operator_delete(local_100.px,(ulong)((long)&(local_f0._M_next)->_M_next + 1));
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
          pHVar13 = (HtmlTag *)operator_new(0x30);
          local_178._0_8_ = &local_168;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"/a","");
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_001682d0;
          (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
               (pointer)&(pHVar13->super_TextHolder).mText.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(pHVar13->super_TextHolder).mText,local_178._0_8_,
                     (byte *)(local_178._0_8_ + local_178._8_8_));
          (pHVar13->super_TextHolder).mCanContainMarkup = false;
          (pHVar13->super_TextHolder).mEncodingFlags = 5;
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_00168060;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                    ((shared_ptr<markdown::Token> *)&local_1c0,pHVar13);
          replacements = (ReplacementTable *)local_e0;
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    (local_e0,(shared_ptr<markdown::Token> *)&local_1c0);
          goto LAB_0014a79f;
        }
        this = (Image *)operator_new(0x68);
        Image::Image(this,&local_1f0,(string *)local_1a0,&local_120);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Image>
                  ((shared_ptr<markdown::Token> *)local_178,this);
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                    *)replacements,(shared_ptr<markdown::Token> *)local_178);
        boost::detail::shared_count::~shared_count((shared_count *)(local_178 + 8));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      if ((string *)local_1a0._0_8_ != (string *)&((string *)local_1a0)->field_2) {
        operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
      }
      uVar19 = local_1f0.field_2._M_allocated_capacity;
      _Var22._M_p = local_1f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_0014aa9e;
    }
    else {
      local_178._0_8_ = &local_168;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_178,first._M_current,local_b0._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_178._0_8_);
LAB_0014aa89:
      uVar19 = local_168._M_allocated_capacity;
      _Var22._M_p = (pointer)local_178._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._0_8_ != &local_168) {
LAB_0014aa9e:
        operator_delete(_Var22._M_p,uVar19 + 1);
      }
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_a8);
    if (local_1c9 == '\0') {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string RawText::_processLinksImagesAndTags(const std::string &src,
	ReplacementTable& replacements, const LinkIds& idTable)
{
	// NOTE: Kludge alert! The "inline link or image" regex should be...
	//
	//   "(?:(!?)\\[(.+?)\\] *\\((.*?)\\))"
	//
	// ...but that fails on the 'Images' test because it includes a "stupid URL"
	// that has parentheses within it. The proper way to deal with this would be
	// to match any nested parentheses, but regular expressions can't handle an
	// unknown number of nested items, so I'm cheating -- the regex for it
	// allows for one (and *only* one) pair of matched parentheses within the
	// URL. It makes the regex hard to follow (it was even harder to get right),
	// but it allows it to pass the test.
	//
	// The "reference link or image" one has a similar problem; it should be...
	//
	//   "|(?:(!?)\\[(.+?)\\](?: *\\[(.*?)\\])?)"
	//
	static const boost::regex cExpression(
		"(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))" // Inline link or image
		"|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)" // Reference link or image
		"|(?:<(/?([a-zA-Z0-9]+).*?)>)" // potential HTML tag or auto-link
	);
	// Important captures: 1/4=image indicator, 2/5=contents/alttext,
	// 3=URL/title, 6=optional link ID, 7=potential HTML tag or auto-link
	// contents, 8=actual tag from 7.

	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cExpression)) {
			assert(m[0].matched);
			assert(m[0].length()!=0);

			tgt+=std::string(prev, m[0].first);
			tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images1\x01";
			prev=m[0].second;

			bool isImage=false, isLink=false, isReference=false;
			if (m[4].matched && m[4].length()) isImage=isReference=true;
			else if (m[1].matched && m[1].length()) isImage=true;
			else if (m[5].matched) isLink=isReference=true;
			else if (m[2].matched) isLink=true;

			if (isImage || isLink) {
				std::string contentsOrAlttext, url, title;
				bool resolved=false;
				if (isReference) {
					contentsOrAlttext=m[5];
					std::string linkId=(m[6].matched ? std::string(m[6]) : std::string());
					if (linkId.empty()) linkId=cleanTextLinkRef(contentsOrAlttext);

					optional<markdown::LinkIds::Target> target=idTable.find(linkId);
					if (target) { url=target->url; title=target->title; resolved=true; };
				} else {
					static const boost::regex cReference("^<?([^ >]*)>?(?: *(?:('|\")(.*)\\2)|(?:\\((.*)\\)))? *$");
					// Useful captures: 1=url, 3/4=title
					contentsOrAlttext=m[2];
					std::string urlAndTitle=m[3];
					boost::smatch mm;
					if (boost::regex_match(urlAndTitle, mm, cReference)) {
						url=mm[1];
						if (mm[3].matched) title=mm[3];
						else if (mm[4].matched) title=mm[4];
						resolved=true;
					}
				}

				if (!resolved) {
					// Just encode the first character as-is, and continue
					// searching after it.
					prev=m[0].first+1;
					replacements.push_back(TokenPtr(new RawText(std::string(m[0].first, prev))));
				} else if (isImage) {
					replacements.push_back(TokenPtr(new Image(contentsOrAlttext,
						url, title)));
				} else {
					replacements.push_back(TokenPtr(new HtmlAnchorTag(url, title)));
					tgt+=contentsOrAlttext;
					tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images2\x01";
					replacements.push_back(TokenPtr(new HtmlTag("/a")));
				}
			} else {
				// Otherwise it's an HTML tag or auto-link.
				std::string contents=m[7];

//				cerr << "Evaluating potential HTML or auto-link: " << contents << endl;
//				cerr << "m[8]=" << m[8] << endl;

				if (looksLikeUrl(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(contents)));
					subgroup.push_back(TokenPtr(new RawText(contents, false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (looksLikeEmailAddress(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(emailEncode("mailto:"+contents))));
					subgroup.push_back(TokenPtr(new RawText(emailEncode(contents), false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (isValidTag(m[8])) {
					replacements.push_back(TokenPtr(new HtmlTag(_restoreProcessedItems(contents, replacements))));
				} else {
					// Just encode it as-is
					replacements.push_back(TokenPtr(new RawText(m[0])));
				}
			}
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}
	return tgt;
}